

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_shift_left(bitset_t *bitset,size_t s)

{
  size_t newarraysize;
  uint64_t *puVar1;
  uint64_t *puVar2;
  byte bVar3;
  size_t i;
  ulong uVar4;
  byte bVar5;
  uint64_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  
  uVar8 = s >> 6;
  sVar9 = bitset->arraysize;
  newarraysize = uVar8 + sVar9;
  bVar3 = (byte)s & 0x3f;
  if ((s & 0x3f) == 0) {
    bitset_resize(bitset,newarraysize,false);
    for (; uVar8 < uVar8 + sVar9; sVar9 = sVar9 - 1) {
      bitset->array[sVar9 + (uVar8 - 1)] = bitset->array[sVar9 - 1];
    }
  }
  else {
    bitset_resize(bitset,newarraysize + 1,true);
    puVar1 = bitset->array;
    puVar1[newarraysize] = puVar1[sVar9 - 1] >> (-bVar3 & 0x3f);
    bVar5 = (byte)s & 0x3f;
    puVar2 = puVar1;
    for (sVar7 = newarraysize; puVar6 = puVar2 + -1, uVar8 + 2 <= sVar7; sVar7 = sVar7 - 1) {
      puVar6[newarraysize] = puVar2[sVar9 - 2] >> (0x40 - bVar3 & 0x3f) | puVar6[sVar9] << bVar5;
      puVar2 = puVar6;
    }
    puVar1[uVar8] = *puVar1 << bVar5;
  }
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    bitset->array[uVar4] = 0;
  }
  return;
}

Assistant:

void bitset_shift_left(bitset_t *bitset, size_t s) {
    size_t extra_words = s / 64;
    int inword_shift = s % 64;
    size_t as = bitset->arraysize;
    if (inword_shift == 0) {
        bitset_resize(bitset, as + extra_words, false);
        // could be done with a memmove
        for (size_t i = as + extra_words; i > extra_words; i--) {
            bitset->array[i - 1] = bitset->array[i - 1 - extra_words];
        }
    } else {
        bitset_resize(bitset, as + extra_words + 1, true);
        bitset->array[as + extra_words] =
            bitset->array[as - 1] >> (64 - inword_shift);
        for (size_t i = as + extra_words; i >= extra_words + 2; i--) {
            bitset->array[i - 1] =
                (bitset->array[i - 1 - extra_words] << inword_shift) |
                (bitset->array[i - 2 - extra_words] >> (64 - inword_shift));
        }
        bitset->array[extra_words] = bitset->array[0] << inword_shift;
    }
    for (size_t i = 0; i < extra_words; i++) {
        bitset->array[i] = 0;
    }
}